

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterOperations.cpp
# Opt level: O1

string * __thiscall
helics::RerouteFilterOperation::rerouteOperation
          (string *__return_storage_ptr__,RerouteFilterOperation *this,string *src,string *dest)

{
  _Rb_tree_header *p_Var1;
  shared_mutex *__rwlock;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  pointer pcVar2;
  bool bVar3;
  _Rb_tree_node_base *p_Var4;
  regex reg;
  match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_regex<char,_std::__cxx11::regex_traits<char>_> local_50;
  
  __rwlock = &(this->conditions).m_mutex;
  std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
  if ((this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header._M_node_count == 0) {
    gmlc::libguarded::
    atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
    ::load(&local_70,&this->newDest);
    newDestGeneration(__return_storage_ptr__,src,dest,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    p_Var4 = (this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->conditions).m_obj._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var4 != p_Var1) {
      do {
        std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
        basic_regex<std::char_traits<char>,std::allocator<char>>
                  ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&local_50,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1)
                   ,0x10);
        __s._M_current = (dest->_M_dataplus)._M_p;
        local_b8.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_b8._M_begin._M_current = (char *)0x0;
        local_b8.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_b8.
        super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        .
        super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        bVar3 = std::__detail::
                __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,false>
                          (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                )(__s._M_current + dest->_M_string_length),&local_b8,
                           (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&local_50,0x10);
        if (local_b8.
            super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            .
            super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_b8.
                          super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          .
                          super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_b8.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_b8.
                                super_vector<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                .
                                super__Vector_base<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start);
        }
        if (bVar3) {
          gmlc::libguarded::
          atomic_guarded<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::mutex>
          ::load(&local_90,&this->newDest);
          newDestGeneration(__return_storage_ptr__,src,dest,&local_90);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_90._M_dataplus._M_p != &local_90.field_2) {
            operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
          }
          CLI::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&local_50);
          if (bVar3) goto LAB_00227aac;
        }
        else {
          CLI::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
                    (&local_50);
        }
        p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4);
      } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar2 = (dest->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar2,pcVar2 + dest->_M_string_length);
  }
LAB_00227aac:
  pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  return __return_storage_ptr__;
}

Assistant:

std::string RerouteFilterOperation::rerouteOperation(const std::string& src,
                                                     const std::string& dest) const
{
    auto cond = conditions.lock_shared();
    if (cond->empty()) {
        return newDestGeneration(src, dest, newDest.load());
    }

    for (const auto& condition : *cond) {
        const std::regex reg(condition);
        if (std::regex_search(dest, reg, std::regex_constants::match_any)) {
            return newDestGeneration(src, dest, newDest.load());
        }
    }
    return dest;
}